

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.c
# Opt level: O0

int kdf_scrypt_derive(void *vctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  int iVar1;
  long in_RDI;
  uint64_t unaff_R12;
  uint64_t unaff_R14;
  size_t unaff_R15;
  uchar *unaff_retaddr;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  uint64_t in_stack_00000030;
  KDF_SCRYPT *ctx;
  char *in_stack_00000060;
  KDF_SCRYPT *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int line;
  OSSL_PARAM *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  
  line = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) ||
     (iVar1 = kdf_scrypt_set_ctx_params(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90),
     iVar1 == 0)) {
    return 0;
  }
  if (*(long *)(in_RDI + 0x10) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff90,line,in_stack_ffffffffffffff80);
    ERR_set_error(0x39,0x82,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff90,line,in_stack_ffffffffffffff80);
    ERR_set_error(0x39,0x83,(char *)0x0);
    return 0;
  }
  if ((*(long *)(in_RDI + 0x50) == 0) && (iVar1 = set_digest(in_stack_ffffffffffffff78), iVar1 == 0)
     ) {
    return 0;
  }
  iVar1 = scrypt_alg(in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,unaff_R12
                     ,in_stack_00000030,(uint64_t)ctx,(uchar *)params,keylen,(EVP_MD *)key,
                     (OSSL_LIB_CTX *)vctx,in_stack_00000060);
  return iVar1;
}

Assistant:

static int kdf_scrypt_derive(void *vctx, unsigned char *key, size_t keylen,
                             const OSSL_PARAM params[])
{
    KDF_SCRYPT *ctx = (KDF_SCRYPT *)vctx;

    if (!ossl_prov_is_running() || !kdf_scrypt_set_ctx_params(ctx, params))
        return 0;

    if (ctx->pass == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_PASS);
        return 0;
    }

    if (ctx->salt == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_SALT);
        return 0;
    }

    if (ctx->sha256 == NULL && !set_digest(ctx))
        return 0;

    return scrypt_alg((char *)ctx->pass, ctx->pass_len, ctx->salt,
                      ctx->salt_len, ctx->N, ctx->r, ctx->p,
                      ctx->maxmem_bytes, key, keylen, ctx->sha256,
                      ctx->libctx, ctx->propq);
}